

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall Loop::InsertLandingPad(Loop *this,FlowGraph *fg)

{
  RealCount *pRVar1;
  IRKind IVar2;
  uint uVar3;
  Instr *pIVar4;
  BasicBlock *pBVar5;
  BasicBlock *pBVar6;
  BranchInstr *this_00;
  LabelInstr *oldLabelInstr;
  Type pFVar7;
  code *pcVar8;
  bool bVar9;
  BasicBlock *this_01;
  LabelInstr *newLabelInstr;
  undefined4 *puVar10;
  Type *ppBVar11;
  Type *ppFVar12;
  Type pSVar13;
  Loop *currentLoop;
  Func **ppFVar14;
  long lVar15;
  Loop *pLVar16;
  undefined1 local_60 [8];
  EditingIterator iter;
  BasicBlock *local_38;
  BasicBlock *landingPad;
  
  this_01 = GetHeadBlock(this);
  iter.last = (NodeBase *)fg;
  local_38 = BasicBlock::New(fg);
  this->landingPad = local_38;
  pIVar4 = this_01->firstInstr;
  newLabelInstr = IR::LabelInstr::New(Label,pIVar4->m_func,false);
  IR::Instr::SetByteCodeOffset(&newLabelInstr->super_Instr,pIVar4);
  IR::Instr::InsertBefore(pIVar4,&newLabelInstr->super_Instr);
  pBVar5 = local_38;
  if ((local_38 != (BasicBlock *)0x0) && (newLabelInstr->m_block != (BasicBlock *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x2c8,"(this->m_block == nullptr || block == nullptr)",
                       "Overwriting existing block pointer");
    if (!bVar9) goto LAB_0041ade2;
    *puVar10 = 0;
  }
  newLabelInstr->m_block = pBVar5;
  pIVar4 = this_01->firstInstr;
  IVar2 = pIVar4->m_kind;
  if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar9) goto LAB_0041ade2;
    *puVar10 = 0;
  }
  newLabelInstr->m_region = (Region *)pIVar4[1].m_src2;
  pIVar4 = this_01->firstInstr;
  IVar2 = pIVar4->m_kind;
  if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar9) goto LAB_0041ade2;
    *puVar10 = 0;
  }
  newLabelInstr->field_0x78 = newLabelInstr->field_0x78 & 0xfb | *(byte *)&pIVar4[1].m_func & 4;
  uVar3 = *(uint *)&iter.last[0xb].next;
  *(uint *)&iter.last[0xb].next = uVar3 + 1;
  local_38->number = uVar3;
  local_38->firstInstr = &newLabelInstr->super_Instr;
  pBVar5 = this_01->prev;
  local_38->prev = pBVar5;
  pBVar5->next = local_38;
  local_38->next = this_01;
  this_01->prev = local_38;
  pLVar16 = this->parent;
  local_38->loop = pLVar16;
  if (pLVar16 != (Loop *)0x0) {
    do {
      local_60 = (undefined1  [8])&pLVar16->blockList;
      iter.super_Iterator.current = (NodeBase *)0x0;
      iter.super_Iterator.list =
           (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_60;
      do {
        bVar9 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                          ((EditingIterator *)local_60);
        if (!bVar9) goto LAB_0041aa9a;
        ppBVar11 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)local_60);
      } while ((*ppBVar11 != this_01) || ((*(ushort *)&(*ppBVar11)->field_0x18 & 1) != 0));
      SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
                ((EditingIterator *)local_60,
                 (ArenaAllocator *)
                 (((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((long)local_60 + 0x10))->super_SListNodeBase<Memory::ArenaAllocator>).next,
                 &local_38);
LAB_0041aa9a:
      pLVar16 = pLVar16->parent;
    } while (pLVar16 != (Loop *)0x0);
  }
  local_60 = (undefined1  [8])&this_01->predList;
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_60;
  bVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                    ((EditingIterator *)local_60);
  if (bVar9) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)local_60);
      pBVar5 = (*ppFVar12)->predBlock;
      pLVar16 = pBVar5->loop;
      if (pLVar16 != this) {
        bVar9 = pLVar16 != (Loop *)0x0;
        do {
          if (!bVar9) break;
          pLVar16 = pLVar16->parent;
          bVar9 = pLVar16 != (Loop *)0x0;
        } while (pLVar16 != this);
        if (!bVar9) {
          pBVar6 = pBVar5->next;
          ppFVar14 = (Func **)&pBVar6->firstInstr;
          if (pBVar6 == (BasicBlock *)0x0) {
            ppFVar14 = &pBVar5->func;
          }
          lVar15 = 0x18;
          if (pBVar6 == (BasicBlock *)0x0) {
            lVar15 = 0xd0;
          }
          if ((*(char *)(*(long *)((long)&(*ppFVar14)->m_alloc + lVar15) + 0x39) == '\x02') &&
             ((IVar2 = this_01->firstInstr->m_kind, IVar2 == InstrKindProfiledLabel ||
              (IVar2 == InstrKindLabel)))) {
            ppFVar14 = (Func **)&pBVar6->firstInstr;
            if (pBVar6 == (BasicBlock *)0x0) {
              ppFVar14 = &pBVar5->func;
            }
            lVar15 = 0x18;
            if (pBVar6 == (BasicBlock *)0x0) {
              lVar15 = 0xd0;
            }
            this_00 = *(BranchInstr **)((long)&(*ppFVar14)->m_alloc + lVar15);
            if ((this_00->super_Instr).m_kind != InstrKindBranch) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
              if (!bVar9) goto LAB_0041ade2;
              *puVar10 = 0;
            }
            oldLabelInstr = (LabelInstr *)this_01->firstInstr;
            IVar2 = (oldLabelInstr->super_Instr).m_kind;
            if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar9) goto LAB_0041ade2;
              *puVar10 = 0;
            }
            IR::BranchInstr::ReplaceTarget(this_00,oldLabelInstr,newLabelInstr);
          }
          BasicBlock::UnlinkPred(this_01,(*ppFVar12)->predBlock,false);
          pBVar5 = local_38;
          pFVar7 = *ppFVar12;
          pSVar13 = (Type)new<Memory::ArenaAllocator>
                                    (0x10,(ArenaAllocator *)(iter.last)->next,0x366bee);
          pSVar13[1].next = (Type)pFVar7;
          pSVar13->next =
               (pBVar5->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next;
          (pBVar5->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar13;
          pRVar1 = &(pBVar5->predList).
                    super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount;
          pRVar1->count = pRVar1->count + 1;
          (*ppFVar12)->succBlock = local_38;
        }
      }
      bVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)local_60);
    } while (bVar9);
  }
  FlowGraph::AddEdge((FlowGraph *)iter.last,local_38,this_01);
  pIVar4 = this_01->firstInstr;
  IVar2 = pIVar4->m_kind;
  if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar9) goto LAB_0041ade2;
    *puVar10 = 0;
  }
  if (pIVar4[1].m_src2 != (Opnd *)0x0) {
    pIVar4 = this_01->firstInstr;
    IVar2 = pIVar4->m_kind;
    if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar9) {
LAB_0041ade2:
        pcVar8 = (code *)invalidInstructionException();
        (*pcVar8)();
      }
      *puVar10 = 0;
    }
    if (*(char *)&(pIVar4[1].m_src2)->_vptr_Opnd != '\x01') {
      newLabelInstr->field_0x78 = newLabelInstr->field_0x78 | 4;
    }
  }
  return;
}

Assistant:

void
Loop::InsertLandingPad(FlowGraph *fg)
{
    BasicBlock *headBlock = this->GetHeadBlock();

    // Always create a landing pad.  This allows globopt to easily hoist instructions
    // and re-optimize the block if needed.
    BasicBlock *landingPad = BasicBlock::New(fg);
    this->landingPad = landingPad;
    IR::Instr * headInstr = headBlock->GetFirstInstr();
    IR::LabelInstr *landingPadLabel = IR::LabelInstr::New(Js::OpCode::Label, headInstr->m_func);
    landingPadLabel->SetByteCodeOffset(headInstr);
    headInstr->InsertBefore(landingPadLabel);

    landingPadLabel->SetBasicBlock(landingPad);
    landingPadLabel->SetRegion(headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion());
    landingPadLabel->m_hasNonBranchRef = headBlock->GetFirstInstr()->AsLabelInstr()->m_hasNonBranchRef;
    landingPad->SetBlockNum(fg->blockCount++);
    landingPad->SetFirstInstr(landingPadLabel);
    landingPad->SetLastInstr(landingPadLabel);

    landingPad->prev = headBlock->prev;
    landingPad->prev->next = landingPad;
    landingPad->next = headBlock;
    headBlock->prev = landingPad;

    Loop *parentLoop = this->parent;
    landingPad->loop = parentLoop;

    // We need to add this block to the block list of the parent loops
    while (parentLoop)
    {
        // Find the head block in the block list of the parent loop
        FOREACH_BLOCK_IN_LOOP_EDITING(block, parentLoop, iter)
        {
            if (block == headBlock)
            {
                // Add the landing pad to the block list
                iter.InsertBefore(landingPad);
                break;
            }
        } NEXT_BLOCK_IN_LOOP_EDITING;

        parentLoop = parentLoop->parent;
    }

    // Fix predecessor flow edges
    FOREACH_PREDECESSOR_EDGE_EDITING(edge, headBlock, iter)
    {
        // Make sure it isn't a back-edge
        if (edge->GetPred()->loop != this && !this->IsDescendentOrSelf(edge->GetPred()->loop))
        {
            if (edge->GetPred()->GetLastInstr()->IsBranchInstr() && headBlock->GetFirstInstr()->IsLabelInstr())
            {
                IR::BranchInstr *branch = edge->GetPred()->GetLastInstr()->AsBranchInstr();
                branch->ReplaceTarget(headBlock->GetFirstInstr()->AsLabelInstr(), landingPadLabel);
            }
            headBlock->UnlinkPred(edge->GetPred(), false);
            landingPad->AddPred(edge, fg);
            edge->SetSucc(landingPad);
        }
    } NEXT_PREDECESSOR_EDGE_EDITING;

    fg->AddEdge(landingPad, headBlock);

    if (headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion() && headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion()->GetType() != RegionTypeRoot)
    {
        landingPadLabel->m_hasNonBranchRef = true;
    }
}